

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthUdpPort.cpp
# Opt level: O2

int __thiscall EthUdpPort::PacketReceive(EthUdpPort *this,uchar *packet,size_t nbytes)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = SocketInternals::Recv
                    (this->sockPtr,packet,nbytes,(this->super_EthBasePort).ReceiveTimeout);
  if (iVar1 == 8) {
    poVar2 = std::operator<<((this->super_EthBasePort).super_BasePort.outStr,
                             "PacketReceive: only extra data");
    std::endl<char,std::char_traits<char>>(poVar2);
    EthBasePort::ProcessExtraData(&this->super_EthBasePort,packet);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int EthUdpPort::PacketReceive(unsigned char *packet, size_t nbytes)
{
    int nRecv = sockPtr->Recv(packet, nbytes, ReceiveTimeout);
    if (nRecv == static_cast<int>(FW_EXTRA_SIZE)) {
        outStr << "PacketReceive: only extra data" << std::endl;
        ProcessExtraData(packet);
        nRecv = 0;
    }
    return nRecv;
}